

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.h
# Opt level: O2

void __thiscall
cmGetSourceFilePropertyCommand::~cmGetSourceFilePropertyCommand
          (cmGetSourceFilePropertyCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmGetSourceFilePropertyCommand; }